

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O2

ostream * argo::operator<<(ostream *stream,pointer *p)

{
  _List_node_base *p_Var1;
  list<argo::pointer::token,_std::allocator<argo::pointer::token>_> *__range1;
  
  p_Var1 = (_List_node_base *)p;
  while (p_Var1 = (((list<argo::pointer::token,_std::allocator<argo::pointer::token>_> *)
                   &p_Var1->_M_next)->
                  super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>).
                  _M_impl._M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)p) {
    std::operator<<(stream,"/");
    if (*(int *)(p_Var1 + 1) == 2) {
      std::ostream::_M_insert<unsigned_long>((ulong)stream);
    }
    else if (*(int *)(p_Var1 + 1) == 1) {
      std::operator<<(stream,(string *)((long)(p_Var1 + 1) + 8));
    }
  }
  return stream;
}

Assistant:

ostream &NAMESPACE::operator<<(ostream &stream, const pointer &p)
{
    for (auto &t : p.get_path())
    {
        stream << "/";
        if (t.get_type() == pointer::token::object_e)
        {
            stream << t.get_name();
        }
        else if (t.get_type() == pointer::token::array_e)
        {
            stream << t.get_index();
        }
    }

    return stream;
}